

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# private_to_local_pass.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::PrivateToLocalPass::UpdateUses(PrivateToLocalPass *this,Instruction *inst)

{
  uint32_t id_00;
  bool bVar1;
  IRContext *this_00;
  DefUseManager *this_01;
  reference ppIVar2;
  Instruction *use;
  iterator __end2;
  iterator __begin2;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *__range2;
  function<void_(spvtools::opt::Instruction_*)> local_60;
  undefined1 local_40 [8];
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> uses;
  uint32_t id;
  Instruction *inst_local;
  PrivateToLocalPass *this_local;
  
  uses.
  super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = opt::Instruction::result_id(inst);
  std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::vector
            ((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *)
             local_40);
  this_00 = Pass::context(&this->super_Pass);
  this_01 = IRContext::get_def_use_mgr(this_00);
  id_00 = uses.
          super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
  __range2 = (vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *)
             local_40;
  std::function<void(spvtools::opt::Instruction*)>::
  function<spvtools::opt::PrivateToLocalPass::UpdateUses(spvtools::opt::Instruction*)::__0,void>
            ((function<void(spvtools::opt::Instruction*)> *)&local_60,
             (anon_class_8_1_899298ca *)&__range2);
  analysis::DefUseManager::ForEachUser(this_01,id_00,&local_60);
  std::function<void_(spvtools::opt::Instruction_*)>::~function(&local_60);
  __end2 = std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
           ::begin((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                    *)local_40);
  use = (Instruction *)
        std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
        end((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *)
            local_40);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<spvtools::opt::Instruction_**,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
                                *)&use);
    if (!bVar1) {
      this_local._7_1_ = true;
LAB_00873fe3:
      std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
      ~vector((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *
              )local_40);
      return this_local._7_1_;
    }
    ppIVar2 = __gnu_cxx::
              __normal_iterator<spvtools::opt::Instruction_**,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
              ::operator*(&__end2);
    bVar1 = UpdateUse(this,*ppIVar2,inst);
    if (!bVar1) {
      this_local._7_1_ = false;
      goto LAB_00873fe3;
    }
    __gnu_cxx::
    __normal_iterator<spvtools::opt::Instruction_**,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
    ::operator++(&__end2);
  } while( true );
}

Assistant:

bool PrivateToLocalPass::UpdateUses(Instruction* inst) {
  uint32_t id = inst->result_id();
  std::vector<Instruction*> uses;
  context()->get_def_use_mgr()->ForEachUser(
      id, [&uses](Instruction* use) { uses.push_back(use); });

  for (Instruction* use : uses) {
    if (!UpdateUse(use, inst)) {
      return false;
    }
  }
  return true;
}